

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkConvertBlackboxes(Abc_Ntk_t *pNtk)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int local_48;
  int local_44;
  int k;
  int i;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x25c,"Abc_Ntk_t *Abc_NtkConvertBlackboxes(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkWhiteboxNum(pNtk);
  if (iVar1 != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                  ,0x25d,"Abc_Ntk_t *Abc_NtkConvertBlackboxes(Abc_Ntk_t *)");
  }
  pNtk_local = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  pcVar2 = Extra_UtilStrsav(pNtk->pName);
  pNtk_local->pName = pcVar2;
  pcVar2 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_local->pSpec = pcVar2;
  Abc_NtkCleanCopy(pNtk);
  Abc_NtkIncrementTravId(pNtk);
  for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,local_44);
    iVar1 = Abc_ObjIsBlackbox(pAVar3);
    if (iVar1 != 0) {
      Abc_NodeSetTravIdCurrent(pAVar3);
    }
  }
  for (local_44 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,local_44);
    Abc_NodeSetTravIdCurrent(pAVar3);
  }
  for (local_44 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,local_44);
    Abc_NodeSetTravIdCurrent(pAVar3);
  }
  for (local_44 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkPi(pNtk,local_44);
    Abc_NodeSetTravIdPrevious(pAVar3);
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,local_44);
    iVar1 = Abc_ObjIsLatch(pAVar3);
    if (iVar1 != 0) {
      pAVar3 = Abc_NtkBox(pNtk,local_44);
      pAVar3 = Abc_ObjFanin0(pAVar3);
      Abc_NodeSetTravIdPrevious(pAVar3);
    }
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,local_44);
    iVar1 = Abc_ObjIsLatch(pAVar3);
    if (iVar1 != 0) {
      pAVar3 = Abc_NtkBox(pNtk,local_44);
      pAVar3 = Abc_ObjFanout0(pAVar3);
      Abc_NodeSetTravIdPrevious(pAVar3);
    }
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,local_44);
    iVar1 = Abc_ObjIsBlackbox(pAVar3);
    if (iVar1 != 0) {
      for (local_48 = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), local_48 < iVar1; local_48 = local_48 + 1
          ) {
        pAVar5 = Abc_ObjFanout(pAVar3,local_48);
        pAVar4 = Abc_NtkCreatePi(pNtk_local);
        (pAVar5->field_6).pCopy = pAVar4;
      }
    }
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,local_44);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_NodeIsTravIdCurrent(pAVar3), iVar1 == 0)) {
      iVar1 = Abc_ObjIsNet(pAVar3);
      Abc_NtkDupObj(pNtk_local,pAVar3,iVar1);
    }
  }
  for (local_44 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,local_44);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_NodeIsTravIdCurrent(pAVar3), iVar1 == 0)) {
      for (local_48 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_48 < iVar1; local_48 = local_48 + 1)
      {
        pAVar5 = Abc_ObjFanin(pAVar3,local_48);
        Abc_ObjAddFanin((pAVar3->field_6).pCopy,(pAVar5->field_6).pCopy);
      }
    }
  }
  Abc_NtkIncrementTravId(pNtk);
  local_44 = 0;
  do {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= local_44) {
      iVar1 = Abc_NtkCheck(pNtk_local);
      if (iVar1 == 0) {
        fprintf(_stdout,"Abc_NtkConvertBlackboxes(): Network check has failed.\n");
        Abc_NtkDelete(pNtk_local);
        pNtk_local = (Abc_Ntk_t *)0x0;
      }
      return pNtk_local;
    }
    pAVar3 = Abc_NtkCo(pNtk,local_44);
    iVar1 = Abc_ObjFanoutNum(pAVar3);
    if (1 < iVar1) {
      __assert_fail("Abc_ObjFanoutNum(pTerm) <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                    ,0x28c,"Abc_Ntk_t *Abc_NtkConvertBlackboxes(Abc_Ntk_t *)");
    }
    iVar1 = Abc_ObjFanoutNum(pAVar3);
    if (iVar1 < 1) {
LAB_00ad8fe4:
      pAVar3 = Abc_ObjFanin0(pAVar3);
      iVar1 = Abc_NodeIsTravIdCurrent(pAVar3);
      if (iVar1 == 0) {
        Abc_NodeSetTravIdCurrent(pAVar3);
        pAVar5 = Abc_NtkCreatePo(pNtk_local);
        Abc_ObjAddFanin(pAVar5,(pAVar3->field_6).pCopy);
      }
    }
    else {
      pAVar5 = Abc_ObjFanout0(pAVar3);
      iVar1 = Abc_ObjIsLatch(pAVar5);
      if (iVar1 == 0) goto LAB_00ad8fe4;
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkConvertBlackboxes( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNet, * pFanin, * pTerm;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pSpec );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // mark the nodes that should not be connected
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachBlackbox( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    Abc_NtkForEachCi( pNtk, pTerm, i )
        Abc_NodeSetTravIdCurrent( pTerm );
    Abc_NtkForEachCo( pNtk, pTerm, i )
        Abc_NodeSetTravIdCurrent( pTerm );
    // unmark PIs and LIs/LOs
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_NodeSetTravIdPrevious( pTerm );
    Abc_NtkForEachLatchInput( pNtk, pTerm, i )
        Abc_NodeSetTravIdPrevious( pTerm );
    Abc_NtkForEachLatchOutput( pNtk, pTerm, i )
        Abc_NodeSetTravIdPrevious( pTerm );
    // copy the box outputs
    Abc_NtkForEachBlackbox( pNtk, pObj, i )
        Abc_ObjForEachFanout( pObj, pTerm, k )
            pTerm->pCopy = Abc_NtkCreatePi( pNtkNew );

    // duplicate other objects
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            Abc_NtkDupObj( pNtkNew, pObj, Abc_ObjIsNet(pObj) );

    // connect all objects
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // create unique PO for each net feeding into blackboxes or POs
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pTerm, i )
    {
        // skip latch inputs
        assert( Abc_ObjFanoutNum(pTerm) <= 1 );
        if ( Abc_ObjFanoutNum(pTerm) > 0 && Abc_ObjIsLatch(Abc_ObjFanout0(pTerm)) )
            continue;
        // check if the net is visited
        pNet = Abc_ObjFanin0(pTerm);
        if ( Abc_NodeIsTravIdCurrent(pNet) )
            continue;
        // create PO
        Abc_NodeSetTravIdCurrent( pNet );
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNtkNew), pNet->pCopy );
    }

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkConvertBlackboxes(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}